

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_sx_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [16];
  uint in_ESI;
  long lVar2;
  void *in_RDI;
  long in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  uint8_t *src0_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar3 [16];
  __m128i alVar4;
  void *in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_r_hi_b;
  __m128i v_r_lo_b;
  __m128i v_r0_s_b;
  __m128i v_r_b;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i v_shuffle_b;
  undefined8 local_198;
  long local_118;
  void *local_f8;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined4 uStack_40;
  undefined4 uStack_30;
  
  xx_loadu_128("");
  local_118 = in_R8;
  local_f8 = in_RDI;
  do {
    xx_loadl_64(in_stack_00000008);
    auVar1._8_8_ = extraout_XMM0_Qb_00;
    auVar1._0_8_ = src0_00;
    auVar3._8_8_ = extraout_XMM0_Qb;
    auVar3._0_8_ = extraout_XMM0_Qa;
    auVar3 = pshufb(auVar1,auVar3);
    local_98 = (undefined1)uStack_40;
    uStack_97 = (undefined1)((uint)uStack_40 >> 8);
    uStack_96 = (undefined1)((uint)uStack_40 >> 0x10);
    uStack_95 = (undefined1)((uint)uStack_40 >> 0x18);
    uStack_94 = auVar3[0xc];
    uStack_93 = auVar3[0xd];
    uStack_92 = auVar3[0xe];
    uStack_91 = auVar3[0xf];
    uStack_90 = auVar3[0];
    uStack_8f = auVar3[1];
    uStack_8e = auVar3[2];
    uStack_8d = auVar3[3];
    uStack_8c = auVar3[4];
    uStack_8b = auVar3[5];
    uStack_8a = auVar3[6];
    uStack_89 = auVar3[7];
    local_a8 = (undefined1)local_198;
    uStack_a7 = (undefined1)((ulong)local_198 >> 8);
    uStack_a6 = (undefined1)((ulong)local_198 >> 0x10);
    uStack_a5 = (undefined1)((ulong)local_198 >> 0x18);
    uStack_a4 = (undefined1)((ulong)local_198 >> 0x20);
    uStack_a3 = (undefined1)((ulong)local_198 >> 0x28);
    uStack_a2 = (undefined1)((ulong)local_198 >> 0x30);
    uStack_a1 = (undefined1)((ulong)local_198 >> 0x38);
    uStack_a0 = (undefined1)uStack_30;
    uStack_9f = (undefined1)((uint)uStack_30 >> 8);
    uStack_9e = (undefined1)((uint)uStack_30 >> 0x10);
    uStack_9d = (undefined1)((uint)uStack_30 >> 0x18);
    pavgb(local_98,local_a8);
    pavgb(uStack_97,uStack_a7);
    pavgb(uStack_96,uStack_a6);
    pavgb(uStack_95,uStack_a5);
    pavgb(uStack_94,uStack_a4);
    pavgb(uStack_93,uStack_a3);
    pavgb(uStack_92,uStack_a2);
    pavgb(uStack_91,uStack_a1);
    pavgb(uStack_90,uStack_a0);
    pavgb(uStack_8f,uStack_9f);
    pavgb(uStack_8e,uStack_9e);
    pavgb(uStack_8d,uStack_9d);
    pavgb(uStack_8c,uStack_94);
    pavgb(uStack_8b,uStack_93);
    pavgb(uStack_8a,uStack_92);
    pavgb(uStack_89,uStack_91);
    lVar2 = local_118;
    alVar4 = blend_4_u8(src0_00,auVar3._8_8_,auVar3._0_8_,auVar3._0_8_,
                        (__m128i *)CONCAT44(auVar3._12_4_,uStack_40));
    alVar4[0] = lVar2;
    xx_storel_32(local_f8,alVar4);
    local_f8 = (void *)((long)local_f8 + (ulong)in_ESI);
    local_118 = local_118 + (ulong)in_R9D;
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)v_res_b[0]);
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;

  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_r_b = xx_loadl_64(mask);
    const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r_b, v_shuffle_b);
    const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r0_s_b);
    const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r0_s_b);
    const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);
    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}